

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O1

void __thiscall TBSCertList::TBSCertList(TBSCertList *this,TBSCertList *param_1)

{
  pointer pcVar1;
  
  (this->super_DerBase)._vptr_DerBase = (_func_int **)&PTR_EncodedSize_0014ff88;
  (this->super_DerBase).cbData = (param_1->super_DerBase).cbData;
  (this->super_DerBase)._vptr_DerBase = (_func_int **)&PTR_EncodedSize_00150e70;
  (this->version).super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_0014ff88;
  (this->version).super_DerBase.cbData = (param_1->version).super_DerBase.cbData;
  (this->version).super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_00151ab8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->version).value,&(param_1->version).value);
  (this->signature).super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_0014ff88;
  (this->signature).super_DerBase.cbData = (param_1->signature).super_DerBase.cbData;
  (this->signature).super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_001503b8;
  (this->signature).algorithm.super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_0014ff88;
  (this->signature).algorithm.super_DerBase.cbData =
       (param_1->signature).algorithm.super_DerBase.cbData;
  (this->signature).algorithm.super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_00151908;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->signature).algorithm.value,&(param_1->signature).algorithm.value);
  (this->signature).algorithm.oidIndex = (param_1->signature).algorithm.oidIndex;
  (this->signature).parameters.super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_0014ff88
  ;
  (this->signature).parameters.super_DerBase.cbData =
       (param_1->signature).parameters.super_DerBase.cbData;
  (this->signature).parameters.super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_00151828
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->signature).parameters.encodedValue,
             &(param_1->signature).parameters.encodedValue);
  (this->issuer).super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_0014ff88;
  (this->issuer).super_DerBase.cbData = (param_1->issuer).super_DerBase.cbData;
  (this->issuer).super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_00150298;
  (this->issuer).rdnSequence.super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_0014ff88;
  (this->issuer).rdnSequence.super_DerBase.cbData =
       (param_1->issuer).rdnSequence.super_DerBase.cbData;
  (this->issuer).rdnSequence.super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_001502e0;
  std::vector<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>::vector
            (&(this->issuer).rdnSequence.name,&(param_1->issuer).rdnSequence.name);
  (this->thisUpdate).super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_0014ff88;
  (this->thisUpdate).super_DerBase.cbData = (param_1->thisUpdate).super_DerBase.cbData;
  (this->thisUpdate).super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_00151950;
  (this->thisUpdate).value._M_dataplus._M_p = (pointer)&(this->thisUpdate).value.field_2;
  pcVar1 = (param_1->thisUpdate).value._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->thisUpdate).value,pcVar1,
             pcVar1 + (param_1->thisUpdate).value._M_string_length);
  (this->thisUpdate).type = (param_1->thisUpdate).type;
  (this->nextUpdate).super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_0014ff88;
  (this->nextUpdate).super_DerBase.cbData = (param_1->nextUpdate).super_DerBase.cbData;
  (this->nextUpdate).super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_00151950;
  (this->nextUpdate).value._M_dataplus._M_p = (pointer)&(this->nextUpdate).value.field_2;
  pcVar1 = (param_1->nextUpdate).value._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->nextUpdate).value,pcVar1,
             pcVar1 + (param_1->nextUpdate).value._M_string_length);
  (this->nextUpdate).type = (param_1->nextUpdate).type;
  (this->revokedCertificates).super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_0014ff88;
  (this->revokedCertificates).super_DerBase.cbData =
       (param_1->revokedCertificates).super_DerBase.cbData;
  (this->revokedCertificates).super_DerBase._vptr_DerBase = (_func_int **)&PTR_EncodedSize_00150370;
  std::vector<RevocationEntry,_std::allocator<RevocationEntry>_>::vector
            (&(this->revokedCertificates).entries,&(param_1->revokedCertificates).entries);
  (this->crlExtensions).innerType.super_DerBase._vptr_DerBase =
       (_func_int **)&PTR_EncodedSize_0014ff88;
  (this->crlExtensions).innerType.super_DerBase.cbData =
       (param_1->crlExtensions).innerType.super_DerBase.cbData;
  (this->crlExtensions).innerType.super_DerBase._vptr_DerBase =
       (_func_int **)&PTR_EncodedSize_00150328;
  std::vector<Extension,_std::allocator<Extension>_>::vector
            (&(this->crlExtensions).innerType.values,&(param_1->crlExtensions).innerType.values);
  (this->crlExtensions).hasData = (param_1->crlExtensions).hasData;
  return;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData =
			version.EncodedSize() +
			signature.EncodedSize() +
			issuer.EncodedSize() +
			thisUpdate.EncodedSize() +
			nextUpdate.EncodedSize() +
			revokedCertificates.EncodedSize() +
			crlExtensions.EncodedSize();

		return cbData;
	}